

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O0

vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> * __thiscall
adios2::format::BP5Serializer::BreakoutContiguousMetadata
          (BP5Serializer *this,vector<char,_std::allocator<char>_> *Aggregate,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *Counts,
          vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
          *UniqueMetaMetaBlocks,
          vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *AttributeBlocks,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *DataSizes,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *WriterDataPositions)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  char *pcVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RCX;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_RDI;
  undefined8 in_R8;
  value_type *in_R9;
  uint64_t i_4;
  uint64_t i_3;
  uint64_t element;
  uint64_t AEBSize;
  uint64_t i_2;
  uint64_t MEBSize;
  uint64_t i_1;
  MetaMetaInfoBlock New;
  MetaMetaInfoBlock *o;
  iterator __end4;
  iterator __begin4;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *__range4;
  bool Found;
  uint64_t InfoPosition;
  uint64_t IDPosition;
  uint64_t InfoLen;
  uint64_t IDLen;
  uint64_t i;
  uint64_t WDPCount;
  uint64_t DSCount;
  uint64_t ABCount;
  uint64_t MBCount;
  uint64_t NMMBCount;
  size_t Rank;
  size_t Position;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *MetadataBlocks;
  value_type *in_stack_fffffffffffffe78;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_fffffffffffffe80;
  value_type *in_stack_fffffffffffffe88;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_stack_fffffffffffffe90;
  ulong local_148;
  ulong local_140;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> local_138;
  pointer local_120;
  ulong local_118;
  char *local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  char *local_e0;
  long local_d8;
  char *local_d0;
  size_t local_c8;
  reference local_c0;
  MetaMetaInfoBlock *local_b8;
  __normal_iterator<adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
  local_b0;
  undefined8 local_a8;
  byte local_99;
  long local_98;
  long local_90;
  long local_88;
  size_t local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined1 local_39;
  long local_38;
  value_type *local_30;
  undefined8 local_28;
  
  local_38 = 0;
  local_39 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)0xd16a62);
  for (local_48 = 0; uVar1 = local_48,
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RCX),
      uVar1 < sVar4; local_48 = local_48 + 1) {
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xd16aa3);
    helper::CopyFromBuffer<unsigned_long>
              ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
               (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    for (local_78 = 0; local_78 < local_50; local_78 = local_78 + 1) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xd16aef);
      helper::CopyFromBuffer<unsigned_long>
                ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
                 (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xd16b19);
      helper::CopyFromBuffer<unsigned_long>
                ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
                 (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      local_90 = local_38;
      local_98 = local_38 + local_80;
      local_38 = local_98 + local_88;
      local_99 = 0;
      local_a8 = local_28;
      local_b0._M_current =
           (MetaMetaInfoBlock *)
           std::
           vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
           ::begin((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                    *)in_stack_fffffffffffffe78);
      local_b8 = (MetaMetaInfoBlock *)
                 std::
                 vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 ::end((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                        *)in_stack_fffffffffffffe78);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                                 *)in_stack_fffffffffffffe80,
                                (__normal_iterator<adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                                 *)in_stack_fffffffffffffe78), bVar2) {
        local_c0 = __gnu_cxx::
                   __normal_iterator<adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
                   ::operator*(&local_b0);
        if (local_c0->MetaMetaIDLen == local_80) {
          in_stack_fffffffffffffe90 =
               (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)local_c0->MetaMetaID;
          pcVar5 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0xd16c21);
          iVar3 = memcmp(in_stack_fffffffffffffe90,pcVar5 + local_90,local_80);
          if (iVar3 == 0) {
            local_99 = 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<adios2::format::BP5Base::MetaMetaInfoBlock_*,_std::vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>_>
        ::operator++(&local_b0);
      }
      if ((local_99 & 1) == 0) {
        local_e0 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0xd16c7a);
        local_e0 = local_e0 + local_98;
        local_d8 = local_88;
        local_d0 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)0xd16caa);
        local_d0 = local_d0 + local_90;
        local_c8 = local_80;
        std::
        vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        ::push_back(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
    }
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xd16d31);
    helper::CopyFromBuffer<unsigned_long>
              ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
               (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    for (local_f8 = 0; local_f8 < local_58; local_f8 = local_f8 + 1) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xd16d7d);
      helper::CopyFromBuffer<unsigned_long>
                ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
                 (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      local_110 = std::vector<char,_std::allocator<char>_>::data
                            ((vector<char,_std::allocator<char>_> *)0xd16da7);
      local_110 = local_110 + local_38;
      local_108 = local_100;
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::push_back
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      local_38 = local_100 + local_38;
    }
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xd16e16);
    helper::CopyFromBuffer<unsigned_long>
              ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
               (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    for (local_118 = 0; local_118 < local_60; local_118 = local_118 + 1) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xd16e5c);
      helper::CopyFromBuffer<unsigned_long>
                ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
                 (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      in_stack_fffffffffffffe88 = local_30;
      pcVar5 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0xd16e90);
      local_138.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)(pcVar5 + local_38);
      local_138.super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = local_120;
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::push_back
                (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      local_38 = (long)&local_120->iov_base + local_38;
    }
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xd16ef0);
    helper::CopyFromBuffer<unsigned_long>
              ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
               (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    for (local_140 = 0; local_140 < local_68; local_140 = local_140 + 1) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xd16f32);
      in_stack_fffffffffffffe80 = &local_138;
      helper::CopyFromBuffer<unsigned_long>
                ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
                 (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
                 (value_type *)in_stack_fffffffffffffe88);
    }
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xd16f84);
    helper::CopyFromBuffer<unsigned_long>
              ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
               (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
    for (local_148 = 0; local_148 < local_70; local_148 = local_148 + 1) {
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xd16fc6);
      in_stack_fffffffffffffe78 = (value_type *)&local_138;
      helper::CopyFromBuffer<unsigned_long>
                ((char *)in_stack_fffffffffffffe90,(size_t *)in_stack_fffffffffffffe88,
                 (unsigned_long *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe90,
                 (value_type *)in_stack_fffffffffffffe88);
    }
  }
  return in_RDI;
}

Assistant:

std::vector<core::iovec> BP5Serializer::BreakoutContiguousMetadata(
    std::vector<char> &Aggregate, const std::vector<size_t> Counts,
    std::vector<MetaMetaInfoBlock> &UniqueMetaMetaBlocks, std::vector<core::iovec> &AttributeBlocks,
    std::vector<uint64_t> &DataSizes, std::vector<uint64_t> &WriterDataPositions) const
{
    size_t Position = 0;
    std::vector<core::iovec> MetadataBlocks;
    // MetadataBlocks.reserve(Counts.size());
    // DataSizes.resize(Counts.size());
    for (size_t Rank = 0; Rank < Counts.size(); Rank++)
    {
        uint64_t NMMBCount, MBCount, ABCount, DSCount, WDPCount;
        helper::CopyFromBuffer(Aggregate.data(), Position, &NMMBCount);
        for (uint64_t i = 0; i < NMMBCount; i++)
        {
            uint64_t IDLen;
            uint64_t InfoLen;
            helper::CopyFromBuffer(Aggregate.data(), Position, &IDLen);
            helper::CopyFromBuffer(Aggregate.data(), Position, &InfoLen);
            uint64_t IDPosition = Position;
            uint64_t InfoPosition = Position + IDLen;
            Position = InfoPosition + InfoLen;
            bool Found = 0;
            for (auto &o : UniqueMetaMetaBlocks)
            {
                if (o.MetaMetaIDLen != IDLen)
                    continue;
                if (std::memcmp(o.MetaMetaID, Aggregate.data() + IDPosition, IDLen) == 0)
                    Found = true;
            }
            if (!Found)
            {
                MetaMetaInfoBlock New = {Aggregate.data() + InfoPosition, InfoLen,
                                         Aggregate.data() + IDPosition, IDLen};
                UniqueMetaMetaBlocks.push_back(New);
            }
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &MBCount);
        for (uint64_t i = 0; i < MBCount; ++i)
        {
            uint64_t MEBSize;
            helper::CopyFromBuffer(Aggregate.data(), Position, &MEBSize);
            MetadataBlocks.push_back({Aggregate.data() + Position, MEBSize});
            Position += MEBSize;
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &ABCount);
        for (uint64_t i = 0; i < ABCount; ++i)
        {
            uint64_t AEBSize;
            helper::CopyFromBuffer(Aggregate.data(), Position, &AEBSize);
            AttributeBlocks.push_back({Aggregate.data() + Position, AEBSize});
            Position += AEBSize;
        }
        uint64_t element;
        helper::CopyFromBuffer(Aggregate.data(), Position, &DSCount);
        for (uint64_t i = 0; i < DSCount; ++i)
        {
            helper::CopyFromBuffer(Aggregate.data(), Position, &element);
            DataSizes.push_back(element);
        }
        helper::CopyFromBuffer(Aggregate.data(), Position, &WDPCount);
        for (uint64_t i = 0; i < WDPCount; ++i)
        {
            helper::CopyFromBuffer(Aggregate.data(), Position, &element);
            WriterDataPositions.push_back(element);
        }
    }
    return MetadataBlocks;
}